

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::exception<char_const(&)[34],unsigned_char&,char_const(&)[2]>
          (exception *this,char (*args) [34],uchar *args_1,char (*args_2) [2])

{
  char (*in_R8) [2];
  string local_48;
  char (*local_28) [2];
  char (*args_local_2) [2];
  uchar *args_local_1;
  char (*args_local) [34];
  exception *this_local;
  
  local_28 = args_2;
  args_local_2 = (char (*) [2])args_1;
  args_local_1 = (uchar *)args;
  args_local = (char (*) [34])this;
  make_string<char_const(&)[34],unsigned_char&,char_const(&)[2]>
            (&local_48,(util *)args,(char (*) [34])args_1,(uchar *)args_2,in_R8);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}